

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<unsigned_long,long_double>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,unsigned_long *t_lhs,
          unsigned_long *c_lhs,longdouble *c_rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ulong uVar2;
  undefined8 *puVar3;
  bool b;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  Boxed_Value BVar7;
  longdouble local_b8 [6];
  unsigned_long local_58;
  unsigned_long local_50;
  unsigned_long local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  unsigned_long local_30;
  unsigned_long local_28;
  unsigned_long local_20;
  unsigned_long local_18;
  unsigned_long local_10;
  
  switch(t_oper) {
  case equals:
    local_58 = *c_lhs;
    b = (longdouble)(long)local_58 +
        (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)local_58 < 0) * 4) == *c_rhs;
    break;
  case less_than:
    local_50 = *c_lhs;
    lVar5 = (longdouble)(long)local_50 +
            (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)local_50 < 0) * 4);
    lVar4 = *c_rhs;
    goto LAB_002de8d7;
  case greater_than:
    local_48 = *c_lhs;
    lVar4 = (longdouble)(long)local_48 +
            (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)local_48 < 0) * 4);
    lVar5 = *c_rhs;
LAB_002de8d7:
    b = lVar5 < lVar4;
    break;
  case less_than_equal:
    local_40 = *c_lhs;
    lVar5 = (longdouble)(long)local_40 +
            (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)local_40 < 0) * 4);
    lVar4 = *c_rhs;
    goto LAB_002de876;
  case greater_than_equal:
    local_38 = *c_lhs;
    lVar4 = (longdouble)(long)local_38 +
            (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)local_38 < 0) * 4);
    lVar5 = *c_rhs;
LAB_002de876:
    b = lVar5 <= lVar4;
    break;
  case not_equal:
    local_30 = *c_lhs;
    b = (longdouble)(long)local_30 +
        (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)local_30 < 0) * 4) != *c_rhs;
    break;
  default:
    switch(t_oper) {
    case sum:
      local_28 = *c_lhs;
      local_b8[0] = *c_rhs + (longdouble)(long)local_28 +
                             (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)local_28 < 0) * 4)
      ;
      break;
    case quotient:
      local_20 = *c_lhs;
      local_b8[0] = ((longdouble)(long)local_20 +
                    (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)local_20 < 0) * 4)) /
                    *c_rhs;
      break;
    case product:
      local_18 = *c_lhs;
      local_b8[0] = *c_rhs * ((longdouble)(long)local_18 +
                             (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)local_18 < 0) * 4)
                             );
      break;
    case difference:
      local_10 = *c_lhs;
      local_b8[0] = ((longdouble)(long)local_10 +
                    (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)local_10 < 0) * 4)) -
                    *c_rhs;
      break;
    default:
      if (t_lhs == (unsigned_long *)0x0) {
switchD_002de7a7_caseD_7:
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = &PTR__bad_cast_003c3eb8;
        __cxa_throw(puVar3,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      switch(t_oper) {
      case assign:
        lVar5 = *c_rhs;
        lVar6 = (longdouble)9.223372e+18;
        lVar4 = (longdouble)0;
        if (lVar6 <= lVar5) {
          lVar4 = lVar6;
        }
        uVar2 = (ulong)(lVar6 <= lVar5) << 0x3f ^ (long)ROUND(lVar5 - lVar4);
        break;
      default:
        goto switchD_002de7a7_caseD_7;
      case assign_product:
        lVar6 = ((longdouble)(long)*t_lhs +
                (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)*t_lhs < 0) * 4)) * *c_rhs;
        lVar4 = (longdouble)9.223372e+18;
        lVar5 = (longdouble)0;
        if (lVar4 <= lVar6) {
          lVar5 = lVar4;
        }
        uVar2 = (ulong)(lVar4 <= lVar6) << 0x3f ^ (long)ROUND(lVar6 - lVar5);
        break;
      case assign_sum:
        lVar6 = (longdouble)(long)*t_lhs +
                (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)*t_lhs < 0) * 4) + *c_rhs;
        lVar4 = (longdouble)9.223372e+18;
        lVar5 = (longdouble)0;
        if (lVar4 <= lVar6) {
          lVar5 = lVar4;
        }
        uVar2 = (ulong)(lVar4 <= lVar6) << 0x3f ^ (long)ROUND(lVar6 - lVar5);
        break;
      case assign_quotient:
        lVar6 = ((longdouble)(long)*t_lhs +
                (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)*t_lhs < 0) * 4)) / *c_rhs;
        lVar4 = (longdouble)9.223372e+18;
        lVar5 = (longdouble)0;
        if (lVar4 <= lVar6) {
          lVar5 = lVar4;
        }
        uVar2 = (ulong)(lVar4 <= lVar6) << 0x3f ^ (long)ROUND(lVar6 - lVar5);
        break;
      case assign_difference:
        lVar6 = ((longdouble)(long)*t_lhs +
                (longdouble)*(float *)(&DAT_0034f0c8 + (ulong)((long)*t_lhs < 0) * 4)) - *c_rhs;
        lVar4 = (longdouble)9.223372e+18;
        lVar5 = (longdouble)0;
        if (lVar4 <= lVar6) {
          lVar5 = lVar4;
        }
        uVar2 = (ulong)(lVar4 <= lVar6) << 0x3f ^ (long)ROUND(lVar6 - lVar5);
      }
      *t_lhs = uVar2;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (t_bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var1 = (t_bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var1;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      goto LAB_002de95d;
    }
    BVar7 = detail::const_var_impl<long_double>((detail *)this,local_b8);
    t_bv = BVar7.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
    goto LAB_002de95d;
  }
  BVar7 = const_var((chaiscript *)this,b);
  t_bv = BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
LAB_002de95d:
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }